

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloorCaseInstance::compare
          (FloorCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  float fVar2;
  pointer pSVar3;
  void *pvVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  Hex<8UL> hex;
  ulong uVar9;
  deUint32 aBits;
  int roundedVal;
  int iVar10;
  deUint32 u32;
  float value;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)((long)&(pSVar3->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (uVar1 - 1 < 2) {
    uVar8 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar8;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      pvVar4 = *outputs;
      local_34.value = floorf(*(float *)((long)*inputs + uVar8 * 4));
      fVar11 = *(float *)((long)pvVar4 + uVar8 * 4);
      uVar7 = (int)local_34.value - (int)fVar11;
      if ((uint)local_34.value < (uint)fVar11) {
        uVar7 = -((int)local_34.value - (int)fVar11);
      }
      if (uVar7 != 0) {
        poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
        poVar6 = std::operator<<(poVar6,"] = ");
        poVar6 = anon_unknown_0::operator<<(poVar6,&local_34);
        poVar6 = std::operator<<(poVar6,", got ULP diff ");
LAB_00783ac7:
        hex.value._4_4_ = 0;
        hex.value._0_4_ = uVar7;
        tcu::Format::operator<<(poVar6,hex);
        return false;
      }
    }
  }
  else {
    uVar7 = ~(-1 << (0x17U - (char)*(int *)(&DAT_009ceaec + (ulong)uVar1 * 4) & 0x1f));
    fVar11 = getEpsFromBits(value,*(int *)(&DAT_009ceaec + (ulong)uVar1 * 4));
    uVar8 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar8;
    }
    for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      fVar13 = *(float *)((long)*inputs + uVar8 * 4);
      fVar2 = *(float *)((long)*outputs + uVar8 * 4);
      fVar12 = floorf(fVar13 - fVar11);
      fVar13 = floorf(fVar13 + fVar11);
      iVar10 = (int)fVar12;
      do {
        if ((int)fVar13 < iVar10) {
          poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                   "Expected [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
          poVar6 = std::operator<<(poVar6,"] = [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)fVar12);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)fVar13);
          poVar6 = std::operator<<(poVar6,"] with ULP threshold ");
          goto LAB_00783ac7;
        }
        fVar14 = (float)iVar10;
        uVar1 = (int)fVar14 - (int)fVar2;
        if ((uint)fVar14 < (uint)fVar2) {
          uVar1 = -((int)fVar14 - (int)fVar2);
        }
        iVar10 = iVar10 + 1;
      } while (uVar7 < uVar1);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFloor(in0);

				const deUint32	ulpDiff		= getUlpDiff(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatFloor(in0-eps));
				const int		maxRes		= int(deFloatFloor(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiff(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}